

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.h
# Opt level: O0

pair<char_*,_bool> google::protobuf::io::as_string_data(string *s)

{
  pair<char_*,_bool> pVar1;
  bool local_29;
  char *local_28;
  char *p;
  string *s_local;
  
  p = (char *)s;
  local_28 = mutable_string_data(s);
  local_29 = true;
  pVar1 = std::make_pair<char*&,bool>(&local_28,&local_29);
  return pVar1;
}

Assistant:

inline std::pair<char*, bool> as_string_data(string* s) {
  char *p = mutable_string_data(s);
#ifdef LANG_CXX11
  return std::make_pair(p, true);
#else
  return make_pair(p, p != NULL);
#endif
}